

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

weak_ordering compareThreeWay(QUrl *lhs,QUrl *rhs)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int cmp;
  bool thatIsEmpty;
  bool thisIsEmpty;
  int in_stack_ffffffffffffffa8;
  CaseSensitivity in_stack_ffffffffffffffac;
  QUrlPrivate *in_stack_ffffffffffffffb0;
  CompareUnderlyingType *pCVar6;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  CompareUnderlyingType *local_40;
  bool local_32;
  bool local_31;
  CompareUnderlyingType local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI == 0) || (*in_RSI == 0)) {
    local_31 = true;
    if (*in_RDI != 0) {
      local_31 = QUrlPrivate::isEmpty(in_stack_ffffffffffffffb0);
    }
    local_32 = true;
    if (*in_RSI != 0) {
      local_32 = QUrlPrivate::isEmpty(in_stack_ffffffffffffffb0);
    }
    if (local_31 == false) {
      local_9 = '\x01';
    }
    else if (local_32 == false) {
      local_9 = -1;
    }
    else {
      local_9 = '\0';
    }
  }
  else {
    iVar4 = QString::compare((QString *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (QString *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (iVar4 == 0) {
      iVar4 = QString::compare((QString *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                               (QString *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      if (iVar4 == 0) {
        iVar4 = QString::compare((QString *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 (QString *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        if (iVar4 == 0) {
          iVar4 = QString::compare((QString *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                   (QString *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
          if (iVar4 == 0) {
            if (*(int *)(*in_RDI + 4) == *(int *)(*in_RSI + 4)) {
              iVar4 = QString::compare((QString *)
                                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                                       ,(QString *)in_stack_ffffffffffffffb0,
                                       in_stack_ffffffffffffffac);
              if (iVar4 == 0) {
                bVar2 = QUrlPrivate::hasQuery((QUrlPrivate *)*in_RDI);
                bVar3 = QUrlPrivate::hasQuery((QUrlPrivate *)*in_RSI);
                if (bVar2 == bVar3) {
                  iVar4 = QString::compare((QString *)
                                           CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8),
                                           (QString *)in_stack_ffffffffffffffb0,
                                           in_stack_ffffffffffffffac);
                  if (iVar4 == 0) {
                    bVar2 = QUrlPrivate::hasFragment((QUrlPrivate *)*in_RDI);
                    uVar5 = (uint)bVar2;
                    bVar2 = QUrlPrivate::hasFragment((QUrlPrivate *)*in_RSI);
                    if (uVar5 == bVar2) {
                      QString::compare((QString *)CONCAT44(uVar5,in_stack_ffffffffffffffb8),
                                       (QString *)in_stack_ffffffffffffffb0,
                                       in_stack_ffffffffffffffac);
                      Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
                      local_9 = (CompareUnderlyingType)
                                Qt::strong_ordering::operator_cast_to_weak_ordering
                                          ((strong_ordering *)in_stack_ffffffffffffffb0);
                    }
                    else {
                      bVar2 = QUrlPrivate::hasFragment((QUrlPrivate *)*in_RSI);
                      if (bVar2) {
                        pCVar6 = &Qt::weak_ordering::less;
                      }
                      else {
                        pCVar6 = "\x01";
                      }
                      local_9 = *pCVar6;
                    }
                  }
                  else {
                    Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
                    local_9 = (CompareUnderlyingType)
                              Qt::strong_ordering::operator_cast_to_weak_ordering
                                        ((strong_ordering *)in_stack_ffffffffffffffb0);
                  }
                }
                else {
                  bVar2 = QUrlPrivate::hasQuery((QUrlPrivate *)*in_RSI);
                  if (bVar2) {
                    local_40 = &Qt::weak_ordering::less;
                  }
                  else {
                    local_40 = "\x01";
                  }
                  local_9 = *local_40;
                }
              }
              else {
                Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
                local_9 = (CompareUnderlyingType)
                          Qt::strong_ordering::operator_cast_to_weak_ordering
                                    ((strong_ordering *)in_stack_ffffffffffffffb0);
              }
            }
            else {
              Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
              local_9 = (CompareUnderlyingType)
                        Qt::strong_ordering::operator_cast_to_weak_ordering
                                  ((strong_ordering *)in_stack_ffffffffffffffb0);
            }
          }
          else {
            Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
            local_9 = (CompareUnderlyingType)
                      Qt::strong_ordering::operator_cast_to_weak_ordering
                                ((strong_ordering *)in_stack_ffffffffffffffb0);
          }
        }
        else {
          Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
          local_9 = (CompareUnderlyingType)
                    Qt::strong_ordering::operator_cast_to_weak_ordering
                              ((strong_ordering *)in_stack_ffffffffffffffb0);
        }
      }
      else {
        Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
        local_9 = (CompareUnderlyingType)
                  Qt::strong_ordering::operator_cast_to_weak_ordering
                            ((strong_ordering *)in_stack_ffffffffffffffb0);
      }
    }
    else {
      Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffa8,0);
      local_9 = (CompareUnderlyingType)
                Qt::strong_ordering::operator_cast_to_weak_ordering
                          ((strong_ordering *)in_stack_ffffffffffffffb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (weak_ordering)local_9;
  }
  __stack_chk_fail();
}

Assistant:

Qt::weak_ordering compareThreeWay(const QUrl &lhs, const QUrl &rhs)
{
    if (!lhs.d || !rhs.d) {
        bool thisIsEmpty = !lhs.d || lhs.d->isEmpty();
        bool thatIsEmpty = !rhs.d || rhs.d->isEmpty();

        // sort an empty URL first
        if (thisIsEmpty) {
            if (!thatIsEmpty)
                return Qt::weak_ordering::less;
            else
                return Qt::weak_ordering::equivalent;
        } else {
            return Qt::weak_ordering::greater;
        }
    }

    int cmp;
    cmp = lhs.d->scheme.compare(rhs.d->scheme);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->userName.compare(rhs.d->userName);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->password.compare(rhs.d->password);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    cmp = lhs.d->host.compare(rhs.d->host);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->port != rhs.d->port)
        return Qt::compareThreeWay(lhs.d->port, rhs.d->port);

    cmp = lhs.d->path.compare(rhs.d->path);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->hasQuery() != rhs.d->hasQuery())
        return rhs.d->hasQuery() ? Qt::weak_ordering::less : Qt::weak_ordering::greater;

    cmp = lhs.d->query.compare(rhs.d->query);
    if (cmp != 0)
        return Qt::compareThreeWay(cmp, 0);

    if (lhs.d->hasFragment() != rhs.d->hasFragment())
        return rhs.d->hasFragment() ? Qt::weak_ordering::less : Qt::weak_ordering::greater;

    cmp = lhs.d->fragment.compare(rhs.d->fragment);
    return Qt::compareThreeWay(cmp, 0);
}